

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

pointVector * __thiscall Image::getBoundaries(pointVector *__return_storage_ptr__,Image *this)

{
  int in_R8D;
  int j;
  long lVar1;
  int i;
  long lVar2;
  _InputArray local_f8;
  undefined1 local_e0 [16];
  undefined8 local_d0;
  Image edges;
  
  sobel((Image *)local_e0,this);
  getBinaryMatrix((intMatrix *)&local_f8,(Image *)local_e0);
  Image(&edges,(intMatrix *)&local_f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_f8);
  cv::Mat::~Mat((Mat *)local_e0);
  local_d0 = 0;
  local_f8.sz.width = 0;
  local_f8.sz.height = 0;
  local_e0._0_4_ = 0x1010000;
  local_f8.flags = 0x2010000;
  local_f8.obj = &edges;
  local_e0._8_8_ = &edges;
  cv::cvtColor((cv *)local_e0,&local_f8,(_OutputArray *)0x6,0,in_R8D);
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar2 = 0; lVar2 < (int)edges._8_4_; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 < (int)edges._12_4_; lVar1 = lVar1 + 1) {
      if (*(char *)(lVar1 + *(long *)edges._72_8_ * lVar2 + edges._16_8_) == -1) {
        local_e0._0_4_ = (undefined4)lVar1;
        local_e0._4_4_ = (undefined4)lVar2;
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)__return_storage_ptr__
                   ,(Point_<int> *)local_e0);
      }
    }
  }
  cv::Mat::~Mat(&edges.content);
  return __return_storage_ptr__;
}

Assistant:

pointVector Image::getBoundaries() {
    Image edges(this->sobel().getBinaryMatrix());
    // Fix using the binary matrix
    cv::cvtColor(edges.content, edges.content, cv::COLOR_BGR2GRAY);
    pointVector boundaries;
    for(int i = 0; i<edges.content.rows;++i){
        for(int j=0; j<edges.content.cols;++j){
            if(edges.content.at<uchar>(i,j)==ON)
                boundaries.push_back(cv::Point(j,i));
        }
    }
    return boundaries;
}